

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O0

int aura_core_start_call
              (aura_node *node,aura_object *o,
              _func_void_aura_node_ptr_int_aura_buffer_ptr_void_ptr *calldonecb,void *arg,
              aura_buffer *buf)

{
  int iVar1;
  void *pvVar2;
  _Bool is_first;
  aura_eventloop *loop;
  aura_buffer *buf_local;
  void *arg_local;
  _func_void_aura_node_ptr_int_aura_buffer_ptr_void_ptr *calldonecb_local;
  aura_object *o_local;
  aura_node *node_local;
  
  pvVar2 = aura_node_eventloop_get_autocreate(node);
  if (o == (aura_object *)0x0) {
    node_local._4_4_ = -0x39;
  }
  else if (node->status == AURA_STATUS_ONLINE) {
    if (o->pending == 0) {
      if (pvVar2 == (void *)0x0) {
        BUG(node,"Node has no assosiated event system. Fix your code!");
      }
      o->calldonecb = calldonecb;
      o->arg = arg;
      buf->object = o;
      o->pending = o->pending + 1;
      iVar1 = list_empty(&node->outbound_buffers);
      aura_queue_buffer(&node->outbound_buffers,buf);
      if (iVar1 != 0) {
        (*node->tr->handle_event)(node,NODE_EVENT_HAVE_OUTBOUND,(aura_pollfds *)0x0);
      }
      node_local._4_4_ = 0;
    }
    else {
      node_local._4_4_ = -5;
    }
  }
  else {
    node_local._4_4_ = -8;
  }
  return node_local._4_4_;
}

Assistant:

int aura_core_start_call(struct aura_node *node,
			 struct aura_object *o,
			 void (*calldonecb)(struct aura_node *dev, int status, struct aura_buffer *ret, void *arg),
			 void *arg,
			 struct aura_buffer *buf)
{
	struct aura_eventloop *loop = aura_node_eventloop_get_autocreate(node);

	if (!o)
		return -EBADSLT;

	if (node->status != AURA_STATUS_ONLINE)
		return -ENOEXEC;

	if (o->pending)
		return -EIO;

	if (!loop)
		BUG(node, "Node has no assosiated event system. Fix your code!");

	o->calldonecb = calldonecb;
	o->arg = arg;
	buf->object = o;
	o->pending++;

	bool is_first = list_empty(&node->outbound_buffers);
	aura_queue_buffer(&node->outbound_buffers, buf);
	/* If this is the first buffer queued, notify transport immediately */
	if (is_first)
		node->tr->handle_event(node, NODE_EVENT_HAVE_OUTBOUND, NULL);

	return 0;
}